

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void ggml::cpu::aarch64::gemm<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  int j;
  int iVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong local_f0;
  float *local_e0;
  ulong *local_d0;
  undefined8 local_78 [9];
  
  if (3 < nr) {
    auVar12[8] = 0xf0;
    auVar12._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar12[9] = 0xf0;
    auVar12[10] = 0xf0;
    auVar12[0xb] = 0xf0;
    auVar12[0xc] = 0xf0;
    auVar12[0xd] = 0xf0;
    auVar12[0xe] = 0xf0;
    auVar12[0xf] = 0xf0;
    local_f0 = 0;
    iVar8 = n + 0x1f;
    if (-1 < n) {
      iVar8 = n;
    }
    iVar5 = nc + 3;
    if (-1 < nc) {
      iVar5 = nc;
    }
    local_e0 = s;
    do {
      if (3 < nc) {
        lVar6 = local_f0 * (long)(iVar8 >> 5);
        uVar10 = 0;
        pfVar11 = local_e0;
        local_d0 = (ulong *)((long)vx + 8);
        do {
          local_78[0] = 0;
          local_78[1] = 0;
          local_78[2] = 0;
          local_78[3] = 0;
          local_78[4] = 0;
          local_78[5] = 0;
          local_78[6] = 0;
          local_78[7] = 0;
          if (0x1f < n) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)((long)vy + lVar6 * 0x88 + 0x48);
            vpmovsxbd_avx2(auVar2);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)((long)vy + lVar6 * 0x88 + 8);
            vpmovsxbd_avx2(auVar3);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *local_d0;
            vpand_avx(auVar13,auVar12);
            halt_baddata();
          }
          lVar9 = 0;
          pfVar7 = pfVar11;
          do {
            puVar1 = (undefined8 *)((long)local_78 + lVar9);
            uVar4 = *(undefined8 *)((long)local_78 + lVar9 + 8);
            lVar9 = lVar9 + 0x10;
            *(undefined8 *)pfVar7 = *puVar1;
            *(undefined8 *)(pfVar7 + 2) = uVar4;
            pfVar7 = pfVar7 + bs;
          } while (lVar9 != 0x40);
          pfVar11 = pfVar11 + 4;
          local_d0 = local_d0 + (long)(iVar8 >> 5) * 9;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)(iVar5 >> 2));
      }
      local_e0 = local_e0 + bs * 4;
      local_f0 = local_f0 + 1;
    } while (local_f0 != (uint)nr >> 2);
  }
  return;
}

Assistant:

void gemm<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemm_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}